

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column.cpp
# Opt level: O0

void __thiscall column::column(column *this,string *name,string *flag,int size)

{
  bool bVar1;
  int size_local;
  string *flag_local;
  string *name_local;
  column *this_local;
  
  this->col_offset = 0;
  this->element_size = 0;
  this->element_truesize = 0;
  std::__cxx11::string::string((string *)&this->name);
  std::__cxx11::string::string((string *)&this->flag);
  std::__cxx11::string::operator=((string *)&this->name,(string *)name);
  std::__cxx11::string::operator=((string *)&this->flag,(string *)flag);
  bVar1 = std::operator==(flag,"INT");
  if (bVar1) {
    this->element_truesize = size;
  }
  else {
    this->element_truesize = size + 1;
  }
  this->element_size = size;
  return;
}

Assistant:

column::column(const string &name, const string &flag, int size){
    this->name = name;
    this->flag = flag;
    if(flag == "INT")
        element_truesize = size;
    else
        element_truesize = size + 1;
    element_size = size;
}